

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O3

CURLcode curl_mime_filename(curl_mimepart *part,char *filename)

{
  char *pcVar1;
  
  if (part == (curl_mimepart *)0x0) {
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }
  (*Curl_cfree)(part->filename);
  part->filename = (char *)0x0;
  if (filename != (char *)0x0) {
    pcVar1 = (*Curl_cstrdup)(filename);
    part->filename = pcVar1;
    if (pcVar1 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  return CURLE_OK;
}

Assistant:

CURLcode curl_mime_filename(curl_mimepart *part, const char *filename)
{
  if(!part)
    return CURLE_BAD_FUNCTION_ARGUMENT;

  Curl_safefree(part->filename);

  if(filename) {
    part->filename = strdup(filename);
    if(!part->filename)
      return CURLE_OUT_OF_MEMORY;
  }

  return CURLE_OK;
}